

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O3

char ** mk_attrib_list(char *comma_sep_attrib)

{
  char *__s;
  char *pcVar1;
  long lVar2;
  long lVar3;
  
  strncpy(mk_attrib_list::buf,comma_sep_attrib,0x400);
  __s = strchr(mk_attrib_list::buf,0x2c);
  comma_whacker::nxt = __s;
  if (__s == (char *)0x0) {
    mk_attrib_list::attrib_list[0] = mk_attrib_list::buf;
    lVar2 = 1;
    comma_whacker::p = (char *)0x0;
  }
  else {
    *__s = '\0';
    mk_attrib_list::attrib_list[0] = mk_attrib_list::buf;
    lVar3 = 1;
    do {
      pcVar1 = strchr(__s,0x2c);
      if (pcVar1 != (char *)0x0) {
        *pcVar1 = '\0';
      }
      if (lVar3 == 5) {
        lVar2 = 5;
        comma_whacker::p = pcVar1;
        comma_whacker::nxt = pcVar1;
        goto LAB_00103533;
      }
      lVar2 = lVar3 + 1;
      mk_attrib_list::attrib_list[lVar3] = __s;
      __s = pcVar1;
      lVar3 = lVar2;
    } while (pcVar1 != (char *)0x0);
    comma_whacker::p = (char *)0x0;
  }
LAB_00103533:
  mk_attrib_list::attrib_list[lVar2] = (char *)0x0;
  return mk_attrib_list::attrib_list;
}

Assistant:

const char **
mk_attrib_list(char *comma_sep_attrib)
{
    static char *attrib_list[MAX_N_ATTRIB+1];
    static char buf[1024];
    uint32 i;
    char *attr;

    strncpy (buf, comma_sep_attrib, 1024);

    attr = comma_whacker(buf);
    i = 0;

    do {
	attrib_list[i++] = attr;
    } while ((attr = comma_whacker(NULL)) && (i < MAX_N_ATTRIB));
    attrib_list[i] = NULL;

    if (i == MAX_N_ATTRIB+1) {
	E_WARN("Attribute list may be truncated for acoustic model, increase MAX_N_ATTRIB\n");
    }
    
    return (const char **)attrib_list;
}